

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int archive_read_support_format_rar(archive *_a)

{
  int iVar1;
  void *__s;
  _func_int_archive_read_ptr *unaff_RBX;
  archive *in_RDI;
  _func_int_archive_read_ptr *unaff_R14;
  _func_int_archive_read_ptr *unaff_R15;
  char *in_stack_00000028;
  uint in_stack_00000030;
  uint in_stack_00000034;
  int magic_test;
  int r;
  rar *rar;
  archive_read *a;
  archive_read *in_stack_ffffffffffffffb8;
  archive *read_data_skip;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  read_data_skip = in_RDI;
  iVar1 = __archive_check_magic(_magic_test,in_stack_00000034,in_stack_00000030,in_stack_00000028);
  if (iVar1 == -0x1e) {
    iVar1 = -0x1e;
  }
  else {
    __s = malloc(0x4ef0);
    if (__s == (void *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate rar data");
      iVar1 = -0x1e;
    }
    else {
      memset(__s,0,0x4ef0);
      *(undefined4 *)((long)__s + 0x4ee8) = 0xffffffff;
      iVar1 = __archive_read_register_format
                        (in_stack_ffffffffffffffb8,archive_read_format_rar_has_encrypted_entries,
                         (char *)archive_read_support_format_rar_capabilities,
                         archive_read_format_rar_cleanup,archive_read_format_rar_seek_data,
                         archive_read_format_rar_read_data_skip,
                         (_func_int_archive_read_ptr_void_ptr_ptr_size_t_ptr_int64_t_ptr *)in_RDI,
                         (_func_int_archive_read_ptr *)read_data_skip,
                         (_func_int64_t_archive_read_ptr_int64_t_int *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),unaff_RBX,
                         unaff_R14,unaff_R15);
      if (iVar1 != 0) {
        free(__s);
      }
    }
  }
  return iVar1;
}

Assistant:

int
archive_read_support_format_rar(struct archive *_a)
{
  struct archive_read *a = (struct archive_read *)_a;
  struct rar *rar;
  int r;

  archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
                      "archive_read_support_format_rar");

  rar = (struct rar *)malloc(sizeof(*rar));
  if (rar == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Can't allocate rar data");
    return (ARCHIVE_FATAL);
  }
  memset(rar, 0, sizeof(*rar));

	/*
	 * Until enough data has been read, we cannot tell about
	 * any encrypted entries yet.
	 */
	rar->has_encrypted_entries = ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW;

  r = __archive_read_register_format(a,
                                     rar,
                                     "rar",
                                     archive_read_format_rar_bid,
                                     archive_read_format_rar_options,
                                     archive_read_format_rar_read_header,
                                     archive_read_format_rar_read_data,
                                     archive_read_format_rar_read_data_skip,
                                     archive_read_format_rar_seek_data,
                                     archive_read_format_rar_cleanup,
                                     archive_read_support_format_rar_capabilities,
                                     archive_read_format_rar_has_encrypted_entries);

  if (r != ARCHIVE_OK)
    free(rar);
  return (r);
}